

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
PS2KeyboardSimulationDataGenerator::HostSendByte
          (PS2KeyboardSimulationDataGenerator *this,U8 payload)

{
  int iVar1;
  byte bVar2;
  uint local_20;
  U32 j;
  int ones;
  int i;
  U8 copyofpayload;
  U8 payload_local;
  PS2KeyboardSimulationDataGenerator *this_local;
  
  iVar1 = (int)this;
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mClock);
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mClock);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  ClockGenerator::AdvanceByTimeS(0.000125);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  ones._3_1_ = payload;
  for (j = 0; (int)j < 8; j = j + 1) {
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
    if ((ones._3_1_ & 1) == 0) {
      SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
      ones._3_1_ = (byte)((int)(uint)ones._3_1_ >> 1);
    }
    else {
      SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
      ones._3_1_ = (byte)((int)(uint)ones._3_1_ >> 1);
    }
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(2.0);
    SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  }
  bVar2 = 0;
  ones._2_1_ = payload;
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    bVar2 = bVar2 + (ones._2_1_ & 1);
    ones._2_1_ = (byte)((int)(uint)ones._2_1_ >> 1);
  }
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  if ((bVar2 & 1) == 0) {
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  }
  else {
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  }
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(0.001);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x10);
  return;
}

Assistant:

void PS2KeyboardSimulationDataGenerator::HostSendByte( U8 payload )
{
    // make a copy of the data for calculating parity bit later
    U8 copyofpayload = payload;

    // start bit
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    mClock->TransitionIfNeeded( BIT_HIGH );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );

    // bring the clock low for at least 100 microseconds
    mClock->TransitionIfNeeded( BIT_LOW );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );
    mData->TransitionIfNeeded( BIT_LOW );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( .000125 ) );

    // data, lsb first
    for( int i = 0; i < 8; i++ )
    {
        mClock->Transition();
        mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

        if( payload & 0x01 )
        {
            mData->TransitionIfNeeded( BIT_HIGH );
            payload = payload >> 1;
        }
        else
        {
            mData->TransitionIfNeeded( BIT_LOW );
            payload = payload >> 1;
        }

        mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

        mClock->Transition();
        mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );
    }
    // parity bit
    int ones = 0;

    // sum the ones
    for( U32 j = 0; j < 8; j++ )
    {
        ones = ones + ( copyofpayload & 0x01 );
        copyofpayload = copyofpayload >> 1;
    }

    // if lsb of ones is 1, then there is an odd number of ones, therefore parity =0
    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    if( ones & 0x01 )
        mData->TransitionIfNeeded( BIT_LOW );
    else
        mData->TransitionIfNeeded( BIT_HIGH );


    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );


    // stop bit
    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    mData->TransitionIfNeeded( BIT_HIGH );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    // simulate the ACK
    mData->TransitionIfNeeded( BIT_LOW );
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1 ) );

    // data line idle state is BIT_HIGH
    mData->TransitionIfNeeded( BIT_HIGH );

    mClock->Transition();
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2 ) );
    mClock->Transition();

    // advance to the next time of transmission
    mPS2KeyboardSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( .001 ) );
}